

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O3

int32_t __thiscall icu_63::CollationRootElements::findP(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar4 = this->length - 1;
  do {
    uVar3 = uVar2;
    if ((int)uVar4 <= (int)(uVar3 + 1)) {
      return uVar3;
    }
    uVar5 = (int)(uVar4 + uVar3) / 2;
    uVar6 = (ulong)uVar5;
    uVar7 = puVar1[(int)uVar5];
    if ((char)uVar7 < '\0') {
      if (uVar5 + 1 != uVar4) {
        uVar6 = (long)(int)uVar5 + 1;
        do {
          uVar7 = puVar1[uVar6];
          if (-1 < (char)uVar7) {
            uVar6 = uVar6 & 0xffffffff;
            goto LAB_00239fe3;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != (uint32_t)uVar6);
      }
      if (uVar5 - 1 == uVar3) {
        return uVar3;
      }
      uVar6 = (ulong)(int)(uVar5 - 1);
      while (uVar7 = puVar1[uVar6], (char)uVar7 < '\0') {
        uVar6 = uVar6 - 1;
        if (uVar3 == (uint32_t)uVar6) {
          return uVar3;
        }
      }
    }
LAB_00239fe3:
    uVar2 = (uint32_t)uVar6;
    if (p < (uVar7 & 0xffffff00)) {
      uVar2 = uVar3;
      uVar4 = (uint32_t)uVar6;
    }
  } while( true );
}

Assistant:

int32_t
CollationRootElements::findP(uint32_t p) const {
    // p need not occur as a root primary.
    // For example, it might be a reordering group boundary.
    U_ASSERT((p >> 24) != Collation::UNASSIGNED_IMPLICIT_BYTE);
    // modified binary search
    int32_t start = (int32_t)elements[IX_FIRST_PRIMARY_INDEX];
    U_ASSERT(p >= elements[start]);
    int32_t limit = length - 1;
    U_ASSERT(elements[limit] >= PRIMARY_SENTINEL);
    U_ASSERT(p < elements[limit]);
    while((start + 1) < limit) {
        // Invariant: elements[start] and elements[limit] are primaries,
        // and elements[start]<=p<=elements[limit].
        int32_t i = (start + limit) / 2;
        uint32_t q = elements[i];
        if((q & SEC_TER_DELTA_FLAG) != 0) {
            // Find the next primary.
            int32_t j = i + 1;
            for(;;) {
                if(j == limit) { break; }
                q = elements[j];
                if((q & SEC_TER_DELTA_FLAG) == 0) {
                    i = j;
                    break;
                }
                ++j;
            }
            if((q & SEC_TER_DELTA_FLAG) != 0) {
                // Find the preceding primary.
                j = i - 1;
                for(;;) {
                    if(j == start) { break; }
                    q = elements[j];
                    if((q & SEC_TER_DELTA_FLAG) == 0) {
                        i = j;
                        break;
                    }
                    --j;
                }
                if((q & SEC_TER_DELTA_FLAG) != 0) {
                    // No primary between start and limit.
                    break;
                }
            }
        }
        if(p < (q & 0xffffff00)) {  // Reset the "step" bits of a range end primary.
            limit = i;
        } else {
            start = i;
        }
    }
    return start;
}